

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder_inc.h
# Opt level: O0

void BuildAndStoreEntropyCodesLiteral
               (MemoryManager *m,BlockEncoder *self,HistogramLiteral *histograms,
               size_t histograms_size,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  size_t length;
  size_t n;
  uint16_t *local_68;
  uint8_t *local_60;
  size_t ix;
  size_t i;
  size_t table_size;
  size_t alphabet_size;
  size_t *storage_ix_local;
  HuffmanTree *tree_local;
  size_t histograms_size_local;
  HistogramLiteral *histograms_local;
  BlockEncoder *self_local;
  MemoryManager *m_local;
  
  length = self->alphabet_size_;
  n = histograms_size * length;
  if (n == 0) {
    local_60 = (uint8_t *)0x0;
  }
  else {
    local_60 = (uint8_t *)BrotliAllocate(m,n);
  }
  self->depths_ = local_60;
  if (n == 0) {
    local_68 = (uint16_t *)0x0;
  }
  else {
    local_68 = (uint16_t *)BrotliAllocate(m,n * 2);
  }
  self->bits_ = local_68;
  for (ix = 0; ix < histograms_size; ix = ix + 1) {
    BuildAndStoreHuffmanTree
              (histograms[ix].data_,length,tree,self->depths_ + ix * length,
               self->bits_ + ix * length,storage_ix,storage);
  }
  return;
}

Assistant:

static void FN(BuildAndStoreEntropyCodes)(MemoryManager* m, BlockEncoder* self,
    const HistogramType* histograms, const size_t histograms_size,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  const size_t alphabet_size = self->alphabet_size_;
  const size_t table_size = histograms_size * alphabet_size;
  self->depths_ = BROTLI_ALLOC(m, uint8_t, table_size);
  self->bits_ = BROTLI_ALLOC(m, uint16_t, table_size);
  if (BROTLI_IS_OOM(m)) return;

  {
    size_t i;
    for (i = 0; i < histograms_size; ++i) {
      size_t ix = i * alphabet_size;
      BuildAndStoreHuffmanTree(&histograms[i].data_[0], alphabet_size, tree,
          &self->depths_[ix], &self->bits_[ix], storage_ix, storage);
    }
  }
}